

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Clip_x86_avx512::forward_inplace(Clip_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  uint uVar12;
  long lVar13;
  undefined1 (*pauVar14) [64];
  int iVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined4 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  
  iVar9 = bottom_top_blob->c;
  if (0 < (long)iVar9) {
    uVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    lVar13 = 0;
    do {
      pauVar14 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar13 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar3 = (this->super_Clip).min;
      uVar6 = (this->super_Clip).max;
      auVar23._4_4_ = uVar6;
      auVar23._0_4_ = uVar3;
      auVar23._8_8_ = 0;
      if ((int)uVar12 < 0x10) {
        uVar17 = 0;
      }
      else {
        auVar19 = vbroadcastss_avx512f(auVar23);
        auVar23 = vmovshdup_avx(auVar23);
        auVar20 = vbroadcastsd_avx512f(auVar23);
        iVar15 = 0xf;
        do {
          auVar21 = vmaxps_avx512f(auVar19,*pauVar14);
          auVar21 = vminps_avx512f(auVar21,auVar20);
          *pauVar14 = auVar21;
          pauVar14 = pauVar14 + 1;
          iVar15 = iVar15 + 0x10;
        } while (iVar15 < (int)uVar12);
        uVar4 = (this->super_Clip).min;
        uVar7 = (this->super_Clip).max;
        auVar23._4_4_ = uVar7;
        auVar23._0_4_ = uVar4;
        auVar23._8_8_ = 0;
        uVar17 = uVar12 & 0xfffffff0;
      }
      if ((int)(uVar17 | 7) < (int)uVar12) {
        uVar22 = auVar23._0_4_;
        auVar26._4_4_ = uVar22;
        auVar26._0_4_ = uVar22;
        auVar26._8_4_ = uVar22;
        auVar26._12_4_ = uVar22;
        auVar26._16_4_ = uVar22;
        auVar26._20_4_ = uVar22;
        auVar26._24_4_ = uVar22;
        auVar26._28_4_ = uVar22;
        auVar23 = vmovshdup_avx(auVar23);
        auVar24._0_8_ = auVar23._0_8_;
        auVar24._8_8_ = auVar24._0_8_;
        auVar24._16_8_ = auVar24._0_8_;
        auVar24._24_8_ = auVar24._0_8_;
        uVar16 = uVar17;
        do {
          auVar11 = vmaxps_avx(auVar26,*(undefined1 (*) [32])*pauVar14);
          auVar11 = vminps_avx(auVar11,auVar24);
          *(undefined1 (*) [32])*pauVar14 = auVar11;
          pauVar14 = (undefined1 (*) [64])(*pauVar14 + 0x20);
          uVar17 = uVar16 + 8;
          iVar15 = uVar16 + 0xf;
          uVar16 = uVar17;
        } while (iVar15 < (int)uVar12);
        uVar5 = (this->super_Clip).min;
        uVar8 = (this->super_Clip).max;
        auVar23._4_4_ = uVar8;
        auVar23._0_4_ = uVar5;
        auVar23._8_8_ = 0;
      }
      if ((int)(uVar17 | 3) < (int)uVar12) {
        uVar22 = auVar23._0_4_;
        auVar25._4_4_ = uVar22;
        auVar25._0_4_ = uVar22;
        auVar25._8_4_ = uVar22;
        auVar25._12_4_ = uVar22;
        auVar23 = vshufps_avx(auVar23,auVar23,0x55);
        uVar16 = uVar17;
        do {
          auVar10 = vmaxps_avx(auVar25,*(undefined1 (*) [16])*pauVar14);
          auVar10 = vminps_avx(auVar10,auVar23);
          *(undefined1 (*) [16])*pauVar14 = auVar10;
          pauVar14 = (undefined1 (*) [64])(*pauVar14 + 0x10);
          uVar17 = uVar16 + 4;
          iVar15 = uVar16 + 7;
          uVar16 = uVar17;
        } while (iVar15 < (int)uVar12);
      }
      if (uVar12 - uVar17 != 0 && (int)uVar17 <= (int)uVar12) {
        lVar18 = 0;
        do {
          fVar1 = (this->super_Clip).min;
          fVar2 = *(float *)(*pauVar14 + lVar18 * 4);
          if (*(float *)(*pauVar14 + lVar18 * 4) < fVar1) {
            *(float *)(*pauVar14 + lVar18 * 4) = fVar1;
            fVar2 = fVar1;
          }
          fVar1 = (this->super_Clip).max;
          if (fVar1 < fVar2) {
            *(float *)(*pauVar14 + lVar18 * 4) = fVar1;
          }
          lVar18 = lVar18 + 1;
        } while (uVar12 - uVar17 != (int)lVar18);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != iVar9);
  }
  return 0;
}

Assistant:

int Clip_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}